

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void vex_ExGx(PDISASM pMyDisasm)

{
  Int32 IVar1;
  PDISASM pMyDisasm_local;
  
  verifyVEXvvvv(pMyDisasm);
  if ((pMyDisasm->Reserved_).VEX.L == '\0') {
    IVar1 = 0x110000;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      IVar1 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar1;
    (pMyDisasm->Reserved_).Register_ = 4;
    (pMyDisasm->Reserved_).MemDecoration = 9;
    ExGx(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
    IVar1 = 0x120000;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      IVar1 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar1;
    (pMyDisasm->Reserved_).Register_ = 8;
    (pMyDisasm->Reserved_).MemDecoration = 10;
    ExGx(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
    (pMyDisasm->Instruction).Category = 0x140000;
    (pMyDisasm->Reserved_).Register_ = 0x10;
    (pMyDisasm->Reserved_).MemDecoration = 0xe;
    ExGx(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vex_ExGx(PDISASM pMyDisasm)
{
  verifyVEXvvvv(pMyDisasm);
  if (GV.VEX.L == 0) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
    GV.Register_ = SSE_REG;
    GV.MemDecoration = Arg1_m128_xmm;
    ExGx(pMyDisasm);
  }
  else if (GV.VEX.L == 0x1) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
    GV.Register_ = AVX_REG;
    GV.MemDecoration = Arg1_m256_ymm;
    ExGx(pMyDisasm);
  }
  else if (GV.EVEX.LL == 0x2) {
    pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
    GV.Register_ = AVX512_REG;
    GV.MemDecoration = Arg1_m512_zmm;
    ExGx(pMyDisasm);
  }
}